

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O3

void Wln_NtkRetimeCreateDelayInfo(Wln_Ntk_t *pNtk)

{
  uint uVar1;
  int iVar2;
  Wln_Vec_t *pWVar3;
  int iVar4;
  char *pcVar5;
  int *piVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *paVar10;
  anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *paVar11;
  ulong uVar12;
  
  if ((pNtk->vInstIds).nSize < 1) {
    puts("The design has no delay information.");
    uVar1 = (pNtk->vTypes).nCap;
    if ((pNtk->vInstIds).nCap < (int)uVar1) {
      piVar6 = (pNtk->vInstIds).pArray;
      if (piVar6 == (int *)0x0) {
        piVar6 = (int *)malloc((long)(int)uVar1 << 2);
      }
      else {
        piVar6 = (int *)realloc(piVar6,(long)(int)uVar1 << 2);
      }
      (pNtk->vInstIds).pArray = piVar6;
      if (piVar6 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vInstIds).nCap = uVar1;
    }
    if (0 < (int)uVar1) {
      memset((pNtk->vInstIds).pArray,0,(ulong)uVar1 * 4);
    }
    (pNtk->vInstIds).nSize = uVar1;
    if (1 < (pNtk->vTypes).nSize) {
      piVar6 = (pNtk->vTypes).pArray;
      lVar7 = 1;
      lVar8 = 0x14;
      do {
        iVar4 = piVar6[lVar7];
        uVar1 = iVar4 - 0x59;
        if ((uVar1 < 4) && (uVar1 != 1)) {
          iVar4 = (pNtk->vInstIds).nSize;
          iVar9 = 1;
LAB_0038c5f0:
          if (iVar4 <= lVar7) goto LAB_0038c6e3;
          (pNtk->vInstIds).pArray[lVar7] = iVar9;
        }
        else if ((iVar4 - 5U < 0xfffffffe) && (0 < *(int *)((long)&pNtk->vFanins->nCap + lVar8))) {
          iVar4 = (pNtk->vInstIds).nSize;
          iVar9 = 10;
          goto LAB_0038c5f0;
        }
        lVar7 = lVar7 + 1;
        lVar8 = lVar8 + 0x10;
      } while (lVar7 < (pNtk->vTypes).nSize);
    }
    iVar4 = (pNtk->vCos).nSize;
    if (0 < iVar4) {
      piVar6 = (pNtk->vCos).pArray;
      pWVar3 = pNtk->vFanins;
      lVar7 = 0;
      do {
        iVar9 = piVar6[lVar7];
        paVar10 = &pWVar3[iVar9].field_2;
        iVar9 = pWVar3[iVar9].nSize;
        paVar11 = paVar10;
        if (2 < iVar9) {
          paVar11 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar10->pArray[0];
        }
        iVar2 = paVar11->Array[0];
        if (((long)iVar2 < 0) || ((pNtk->vTypes).nSize <= iVar2)) goto LAB_0038c6c4;
        if ((pNtk->vTypes).pArray[iVar2] != 0x4b) {
          if (2 < iVar9) {
            paVar10 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar10->pArray[0];
          }
          iVar4 = paVar10->Array[0];
          if (((long)iVar4 < 0) || ((pNtk->vInstIds).nSize <= iVar4)) {
LAB_0038c6e3:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          (pNtk->vInstIds).pArray[iVar4] = 1;
          iVar4 = (pNtk->vCos).nSize;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < iVar4);
    }
    puts(
        "Assuming default delays: 10 units for most nodes and 1 unit for bit-slice, concat, and buffers driving COs."
        );
    return;
  }
  puts("Using delays given by the user in the input file.");
  iVar4 = (pNtk->vTypes).nSize;
  if (1 < iVar4) {
    uVar12 = 1;
    do {
      iVar9 = (pNtk->vTypes).pArray[uVar12];
      if ((1 < iVar9 - 3U) && (iVar9 != 0x61)) {
        if ((long)(pNtk->vInstIds).nSize <= (long)uVar12) {
LAB_0038c6c4:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if ((pNtk->vInstIds).pArray[uVar12] == 0) {
          pcVar5 = Abc_OperName(iVar9);
          printf("Warning: Object %d of type %s has zero delay. Retiming will not work correctly.\n"
                 ,uVar12 & 0xffffffff,pcVar5);
          iVar4 = (pNtk->vTypes).nSize;
        }
      }
      uVar12 = uVar12 + 1;
    } while ((long)uVar12 < (long)iVar4);
  }
  return;
}

Assistant:

void Wln_NtkRetimeCreateDelayInfo( Wln_Ntk_t * pNtk )
{
    int i, iObj;
//    if ( Wln_NtkHasInstId(pNtk) )
//        Vec_IntErase( &pNtk->vInstIds );
    if ( Wln_NtkHasInstId(pNtk) )
    {
        printf( "Using delays given by the user in the input file.\n" );
        Wln_NtkForEachObj( pNtk, iObj )
            if ( !Wln_ObjIsCio(pNtk, iObj) && !Wln_ObjIsConst(pNtk, iObj) && Wln_ObjInstId(pNtk, iObj) == 0 )
                printf( "Warning: Object %d of type %s has zero delay. Retiming will not work correctly.\n", iObj, Abc_OperName(Wln_ObjType(pNtk, iObj)) );
    }
    else
    {
        printf( "The design has no delay information.\n" );
        Wln_NtkCleanInstId(pNtk);
        Wln_NtkForEachObj( pNtk, iObj )
        {
            if ( Wln_ObjIsFf(pNtk, iObj) || Wln_ObjType(pNtk, iObj) == ABC_OPER_SLICE || Wln_ObjType(pNtk, iObj) == ABC_OPER_CONCAT )
                Wln_ObjSetInstId( pNtk, iObj, 1 );
            else if ( !Wln_ObjIsCio(pNtk, iObj) && Wln_ObjFaninNum(pNtk, iObj) > 0 )
                Wln_ObjSetInstId( pNtk, iObj, 10 );
        }
        Wln_NtkForEachCo( pNtk, iObj, i ) 
        {
            if ( Wln_ObjType(pNtk, Wln_ObjFanin0(pNtk, iObj)) != ABC_OPER_LUT )
                Wln_ObjSetInstId( pNtk, Wln_ObjFanin0(pNtk, iObj), 1 );
        }
        printf( "Assuming default delays: 10 units for most nodes and 1 unit for bit-slice, concat, and buffers driving COs.\n" );
    }
}